

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng_test.cpp
# Opt level: O3

void __thiscall RNG_Double_Test::TestBody(RNG_Double_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  char *message;
  int iVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  AssertionResult gtest_ar;
  double v;
  Message local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  double local_38;
  
  iVar7 = 10;
  uVar8 = 0x853c49e6748fea9b;
  do {
    uVar3 = (uint)(uVar8 >> 0x2d) ^ (uint)(uVar8 >> 0x1b);
    bVar4 = (byte)(uVar8 >> 0x3b);
    uVar8 = uVar8 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    uVar6 = (uint)(uVar8 >> 0x2d) ^ (uint)(uVar8 >> 0x1b);
    bVar5 = (byte)(uVar8 >> 0x3b);
    auVar1 = vcvtusi2sd_avx512f(in_XMM1,CONCAT44(uVar3 >> bVar4 | uVar3 << 0x20 - bVar4,
                                                 uVar6 >> bVar5 | uVar6 << 0x20 - bVar5));
    auVar9._8_8_ = 0;
    auVar9._0_8_ = auVar1._0_8_ * 5.421010862427522e-20;
    auVar1 = vminsd_avx(auVar9,ZEXT816(0x3fefffffe0000000));
    local_38 = auVar1._0_8_;
    local_58.ss_.ptr_._0_4_ = (float)local_38;
    testing::internal::CmpHelperNE<double,float>
              (local_50,"v","float(v)",&local_38,(float *)&local_58);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message(&local_58);
      message = "";
      if (local_48.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        message = ((local_48.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/rng_test.cpp"
                 ,0x76,message);
      testing::internal::AssertHelper::operator=(&local_40,&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) + 8))();
          in_XMM1._8_8_ = extraout_XMM1_Qb;
          in_XMM1._0_8_ = extraout_XMM1_Qa;
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar8 = uVar8 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  return;
}

Assistant:

TEST(RNG, Double) {
    RNG rng;
    for (int i = 0; i < 10; ++i) {
        double v = rng.Uniform<double>();
        EXPECT_NE(v, float(v));
    }
}